

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::internal::TracingMuxerImpl::SweepDeadBackends(TracingMuxerImpl *this)

{
  const_iterator cVar1;
  bool bVar2;
  _Self __tmp;
  const_iterator __position;
  
  cVar1._M_node =
       (this->dead_backends_).
       super__List_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while (__position._M_node = cVar1._M_node,
        __position._M_node != (_List_node_base *)&this->dead_backends_) {
    cVar1._M_node = (__position._M_node)->_M_next;
    bVar2 = ProducerImpl::SweepDeadServices((ProducerImpl *)__position._M_node[6]._M_next);
    if (bVar2) {
      std::__cxx11::
      list<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
      ::erase(&this->dead_backends_,__position);
    }
  }
  return;
}

Assistant:

void TracingMuxerImpl::SweepDeadBackends() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  for (auto it = dead_backends_.begin(); it != dead_backends_.end();) {
    auto next_it = it;
    next_it++;
    if (it->producer->SweepDeadServices())
      dead_backends_.erase(it);
    it = next_it;
  }
}